

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnFunctionSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index func_index)

{
  Module *pMVar1;
  pointer ppFVar2;
  Func *pFVar3;
  string_view name_00;
  string *orig_name;
  Enum EVar4;
  __buckets_ptr in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  string dollar_name;
  
  orig_name = (string *)name.data_;
  EVar4 = Ok;
  if (name.size_ != 0) {
    pMVar1 = this->module_;
    ppFVar2 = (pMVar1->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)func_index <
        (ulong)((long)(pMVar1->funcs).
                      super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3)) {
      pFVar3 = ppFVar2[func_index];
      if ((pFVar3->name)._M_string_length == 0) {
        name_00.size_._0_4_ = in_stack_ffffffffffffff90;
        name_00.data_ = (char *)in_stack_ffffffffffffff88;
        name_00.size_._4_4_ = in_stack_ffffffffffffff94;
        (anonymous_namespace)::MakeDollarName_abi_cxx11_(name_00);
        GetUniqueName(&dollar_name,(BinaryReaderIR *)&pMVar1->func_bindings,
                      (BindingHash *)&stack0xffffffffffffff88,orig_name);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_assign((string *)pFVar3);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
        ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                    *)&this->module_->func_bindings,&dollar_name,&stack0xffffffffffffff88);
        std::__cxx11::string::_M_dispose();
        EVar4 = Ok;
      }
    }
    else {
      PrintError(this,"invalid function index: %u",(ulong)func_index);
      EVar4 = Error;
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderIR::OnFunctionSymbol(Index index, uint32_t flags,
                                        string_view name, Index func_index) {
  if (name.empty()) {
    return Result::Ok;
  }
  if (func_index >= module_->funcs.size()) {
    PrintError("invalid function index: %" PRIindex, func_index);
    return Result::Error;
  }
  Func* func = module_->funcs[func_index];
  if (!func->name.empty()) {
    // The name section has already named this function.
    return Result::Ok;
  }
  std::string dollar_name =
      GetUniqueName(&module_->func_bindings, MakeDollarName(name));
  func->name = dollar_name;
  module_->func_bindings.emplace(dollar_name, Binding(func_index));
  return Result::Ok;
}